

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O1

DP_RS_Stream
EvpathInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
                attr_list WriterContact,SstStats Stats)

{
  undefined4 uVar1;
  void *__s;
  undefined8 *puVar2;
  CManager p_Var3;
  SMPI_Comm comm;
  CManager p_Var4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char **ppcVar9;
  
  __s = malloc(0xa0);
  puVar2 = (undefined8 *)malloc(0x18);
  p_Var3 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  p_Var4 = (*Svcs->getCManager)(CP_Stream);
  uVar5 = create_attr_list();
  memset(__s,0,0xa0);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  *(void **)((long)__s + 8) = CP_Stream;
  *(SstStats *)((long)__s + 0x90) = Stats;
  *(undefined8 *)((long)__s + 0x98) = 0xffffffffffffffff;
  pthread_mutex_init((pthread_mutex_t *)((long)__s + 0x18),(pthread_mutexattr_t *)0x0);
  SMPI_Comm_rank(comm,(int *)((long)__s + 0x40));
  pcVar6 = Params->WANDataTransport;
  uVar1 = attr_atom_from_string("CM_TRANSPORT");
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "sockets";
  }
  else {
    pcVar6 = Params->WANDataTransport;
  }
  pcVar6 = strdup(pcVar6);
  set_string_attr(uVar5,uVar1,pcVar6);
  if (Params->DataInterface == (char *)0x0) {
    if (Params->NetworkInterface == (char *)0x0) goto LAB_0010a7b4;
    ppcVar9 = &Params->NetworkInterface;
  }
  else {
    ppcVar9 = &Params->DataInterface;
  }
  uVar1 = attr_atom_from_string("IP_INTERFACE");
  pcVar6 = strdup(*ppcVar9);
  set_string_attr(uVar5,uVar1,pcVar6);
LAB_0010a7b4:
  CMlisten_specific(p_Var4,uVar5);
  uVar7 = CMget_specific_contact_list(p_Var4,uVar5);
  uVar8 = attr_list_to_string(uVar7);
  free_attr_list(uVar7);
  free_attr_list(uVar5);
  uVar5 = CMregister_format(p_Var3,EvpathReadRequestStructs);
  *(undefined8 *)((long)__s + 0x10) = uVar5;
  uVar5 = CMregister_format(p_Var3,EvpathReadReplyStructs);
  CMregister_handler(uVar5,EvpathReadReplyHandler,Svcs);
  uVar5 = CMregister_format(p_Var3,EvpathPreloadStructs);
  CMregister_handler(uVar5,EvpathPreloadHandler,Svcs);
  *puVar2 = uVar8;
  puVar2[2] = __s;
  *(undefined8 **)((long)__s + 0x68) = puVar2;
  *ReaderContactInfoPtr = puVar2;
  return __s;
}

Assistant:

static DP_RS_Stream EvpathInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                     struct _SstParams *Params, attr_list WriterContact,
                                     SstStats Stats)
{
    Evpath_RS_Stream Stream = malloc(sizeof(struct _Evpath_RS_Stream));
    EvpathReaderContactInfo Contact = malloc(sizeof(struct _EvpathReaderContactInfo));
    CManager cm = Svcs->getCManager(CP_Stream);
    char *EvpathContactString;
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;
    CManager CM = Svcs->getCManager(CP_Stream);
    attr_list ListenAttrs = create_attr_list();

    memset(Stream, 0, sizeof(*Stream));
    memset(Contact, 0, sizeof(*Contact));

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;
    Stream->Stats = Stats;
    Stream->LastPreloadTimestep = -1;

    pthread_mutex_init(&Stream->DataLock, NULL);

    SMPI_Comm_rank(comm, &Stream->Rank);

    if (Params->WANDataTransport)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("CM_TRANSPORT"),
                        strdup(Params->WANDataTransport));
    }
    else
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("CM_TRANSPORT"), strdup("sockets"));
    }

    if (Params->DataInterface)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Params->DataInterface));
    }
    else if (Params->NetworkInterface)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Params->NetworkInterface));
    }
    CMlisten_specific(CM, ListenAttrs);
    attr_list ContactList = CMget_specific_contact_list(CM, ListenAttrs);

    EvpathContactString = attr_list_to_string(ContactList);

    free_attr_list(ContactList);
    free_attr_list(ListenAttrs);

    /*
     * add a handler for read reply messages
     */
    Stream->ReadRequestFormat = CMregister_format(cm, EvpathReadRequestStructs);
    F = CMregister_format(cm, EvpathReadReplyStructs);
    CMregister_handler(F, EvpathReadReplyHandler, Svcs);

    /*
     * add a handler for timestep preload messages
     */
    F = CMregister_format(cm, EvpathPreloadStructs);
    CMregister_handler(F, EvpathPreloadHandler, Svcs);

    Contact->ContactString = EvpathContactString;
    Contact->RS_Stream = Stream;
    Stream->MyContactInfo = Contact;

    *ReaderContactInfoPtr = Contact;

    return Stream;
}